

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileWatcherSync.hpp
# Opt level: O0

void __thiscall wmj::fileWatcherSync::~fileWatcherSync(fileWatcherSync *this)

{
  bool bVar1;
  reference ppVar2;
  undefined1 local_50 [8];
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pair;
  iterator __end2;
  iterator __begin2;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  fileWatcherSync *this_local;
  
  __end2 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&this->wd_to_file_name);
  pair.second.field_2._8_8_ =
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->wd_to_file_name);
  while (bVar1 = std::operator!=(&__end2,(_Self *)((long)&pair.second.field_2 + 8)), bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&__end2);
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_50,ppVar2);
    remove_wd(this,local_50._0_4_);
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_50);
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end2);
  }
  close(this->inotify_fd);
  this->inotify_fd = 0;
  bVar1 = std::thread::joinable(&this->watch_thread);
  if (bVar1) {
    std::thread::join();
  }
  std::thread::~thread(&this->watch_thread);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->change_file_list);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->wd_to_file_name);
  return;
}

Assistant:

~fileWatcherSync() {
        for(auto pair : this->wd_to_file_name) {
            remove_wd(pair.first);
        }
        close(inotify_fd);
        // 停止文件监视线程
        inotify_fd = 0;
        if(watch_thread.joinable()) {
            watch_thread.join();
        }
    }